

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyBQ2Div(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  bool bVar2;
  int local_3c;
  tmbchar local_38 [4];
  uint indent;
  tmbchar indent_buf [32];
  Node *node_local;
  TidyDocImpl *doc_local;
  
  for (indent_buf._24_8_ = node; indent_buf._24_8_ != 0;
      indent_buf._24_8_ = *(undefined8 *)(indent_buf._24_8_ + 0x10)) {
    if ((((indent_buf._24_8_ == 0) || (*(long *)(indent_buf._24_8_ + 0x38) == 0)) ||
        (**(int **)(indent_buf._24_8_ + 0x38) != 0xf)) || (*(int *)(indent_buf._24_8_ + 0x60) == 0))
    {
      if (*(long *)(indent_buf._24_8_ + 0x18) != 0) {
        prvTidyBQ2Div(doc,*(Node **)(indent_buf._24_8_ + 0x18));
      }
    }
    else {
      local_3c = 1;
      while( true ) {
        BVar1 = HasOneChild((Node *)indent_buf._24_8_);
        bVar2 = false;
        if (((BVar1 != no) && (bVar2 = false, *(long *)(indent_buf._24_8_ + 0x18) != 0)) &&
           ((bVar2 = false, *(long *)(*(long *)(indent_buf._24_8_ + 0x18) + 0x38) != 0 &&
            (bVar2 = false, **(int **)(*(long *)(indent_buf._24_8_ + 0x18) + 0x38) == 0xf)))) {
          bVar2 = *(int *)(indent_buf._24_8_ + 0x60) != 0;
        }
        if (!bVar2) break;
        local_3c = local_3c + 1;
        StripOnlyChild(doc,(Node *)indent_buf._24_8_);
      }
      if (*(long *)(indent_buf._24_8_ + 0x18) != 0) {
        prvTidyBQ2Div(doc,*(Node **)(indent_buf._24_8_ + 0x18));
      }
      prvTidytmbsnprintf(local_38,0x20,"margin-left: %dem",(ulong)(uint)(local_3c << 1));
      RenameElem(doc,(Node *)indent_buf._24_8_,TidyTag_DIV);
      prvTidyAddStyleProperty(doc,(Node *)indent_buf._24_8_,local_38);
    }
  }
  return;
}

Assistant:

void TY_(BQ2Div)( TidyDocImpl* doc, Node *node )
{
    tmbchar indent_buf[ 32 ];
    uint indent;

    while (node)
    {
        if ( nodeIsBLOCKQUOTE(node) && node->implicit )
        {
            indent = 1;

            while( HasOneChild(node) &&
                   nodeIsBLOCKQUOTE(node->content) &&
                   node->implicit)
            {
                ++indent;
                StripOnlyChild( doc, node );
            }

            if (node->content)
                TY_(BQ2Div)( doc, node->content );

            TY_(tmbsnprintf)(indent_buf, sizeof(indent_buf), "margin-left: %dem",
                             2*indent);

            RenameElem( doc, node, TidyTag_DIV );
            TY_(AddStyleProperty)(doc, node, indent_buf );
        }
        else if (node->content)
            TY_(BQ2Div)( doc, node->content );

        node = node->next;
    }
}